

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_InitUndeclRootConstProperty(Var obj,PropertyId propertyId)

{
  bool bVar1;
  JavascriptLibrary *pJVar2;
  ThreadContext *pTVar3;
  undefined8 in_RAX;
  undefined4 uVar5;
  RecyclableObject *pRVar4;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  pRVar4 = VarTo<Js::RecyclableObject>(obj);
  pJVar2 = (((pRVar4->type).ptr)->javascriptLibrary).ptr;
  pTVar3 = ((pJVar2->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x1e])(pRVar4,propertyId,(pJVar2->undeclBlockVarSentinel).ptr,0x93,0,0x90,CONCAT44(uVar5,0xf));
  pTVar3->noJsReentrancy = bVar1;
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitUndeclRootConstProperty(Var obj, PropertyId propertyId)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitUndeclRootConstFld, reentrancylock, instance->GetScriptContext()->GetThreadContext());

        PropertyOperationFlags flags = static_cast<PropertyOperationFlags>(PropertyOperation_SpecialValue | PropertyOperation_AllowUndecl);
        PropertyAttributes attributes = PropertyConstDefaults | PropertyLetConstGlobal;

        instance->SetPropertyWithAttributes(propertyId, instance->GetLibrary()->GetUndeclBlockVar(), attributes, NULL, flags);

        return TRUE;
        JIT_HELPER_END(Op_InitUndeclRootConstFld);
    }